

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

void __thiscall
moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::ImplicitProducer::~ImplicitProducer
          (ImplicitProducer *this)

{
  ulong uVar1;
  BlockIndexHeader *pBVar2;
  ProducerBase *in_RDI;
  bool bVar3;
  BlockIndexHeader *prev;
  size_t i;
  __pointer_type localBlockIndex;
  bool forceFreeLastBlock;
  Block *block;
  __int_type index;
  __int_type tail;
  memory_order __b_1;
  memory_order __b;
  Block *in_stack_ffffffffffffff58;
  ConcurrentQueue<_zframe_t_*,_MyTraits> *in_stack_ffffffffffffff60;
  atomic<unsigned_long> *this_00;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 uVar4;
  size_t local_68;
  __pointer_type local_60;
  Block *local_50;
  ulong local_48;
  
  in_RDI->_vptr_ProducerBase = (_func_int **)&PTR__ImplicitProducer_00375488;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  uVar1 = (in_RDI->tailIndex).super___atomic_base<unsigned_long>._M_i;
  this_00 = &in_RDI->headIndex;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  uVar4 = 0;
  local_48 = (this_00->super___atomic_base<unsigned_long>)._M_i;
  local_50 = (Block *)0x0;
  bVar3 = local_48 != uVar1;
  for (; local_48 != uVar1; local_48 = local_48 + 1) {
    if (((local_48 & 0xff) == 0) || (local_50 == (Block *)0x0)) {
      if (local_50 != (Block *)0x0) {
        add_block_to_free_list(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      }
      in_stack_ffffffffffffff60 =
           (ConcurrentQueue<_zframe_t_*,_MyTraits> *)
           get_block_index_entry_for_index
                     ((ImplicitProducer *)CONCAT44(uVar4,in_stack_ffffffffffffff70),(index_t)this_00
                     );
      local_50 = std::atomic<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::Block_*>::load
                           ((atomic<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::Block_*> *)
                            this_00,(memory_order)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    }
    Block::operator[](local_50,local_48);
  }
  if ((in_RDI->tailBlock != (Block *)0x0) && ((bVar3 || ((uVar1 & 0xff) != 0)))) {
    add_block_to_free_list(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  local_60 = std::
             atomic<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::ImplicitProducer::BlockIndexHeader_*>
             ::load((atomic<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::ImplicitProducer::BlockIndexHeader_*>
                     *)this_00,(memory_order)((ulong)in_stack_ffffffffffffff60 >> 0x20));
  if (local_60 != (__pointer_type)0x0) {
    for (local_68 = 0; local_68 != local_60->capacity; local_68 = local_68 + 1) {
    }
    do {
      pBVar2 = local_60->prev;
      ConcurrentQueueDefaultTraits::free(local_60);
      local_60 = pBVar2;
    } while (pBVar2 != (BlockIndexHeader *)0x0);
  }
  ProducerBase::~ProducerBase(in_RDI);
  return;
}

Assistant:

~ImplicitProducer()
		{
			// Note that since we're in the destructor we can assume that all enqueue/dequeue operations
			// completed already; this means that all undequeued elements are placed contiguously across
			// contiguous blocks, and that only the first and last remaining blocks can be only partially
			// empty (all other remaining blocks must be completely full).
			
#ifdef MOODYCAMEL_CPP11_THREAD_LOCAL_SUPPORTED
			// Unregister ourselves for thread termination notification
			if (!this->inactive.load(std::memory_order_relaxed)) {
				details::ThreadExitNotifier::unsubscribe(&threadExitListener);
			}
#endif
			
			// Destroy all remaining elements!
			auto tail = this->tailIndex.load(std::memory_order_relaxed);
			auto index = this->headIndex.load(std::memory_order_relaxed);
			Block* block = nullptr;
			assert(index == tail || details::circular_less_than(index, tail));
			bool forceFreeLastBlock = index != tail;		// If we enter the loop, then the last (tail) block will not be freed
			while (index != tail) {
				if ((index & static_cast<index_t>(BLOCK_SIZE - 1)) == 0 || block == nullptr) {
					if (block != nullptr) {
						// Free the old block
						this->parent->add_block_to_free_list(block);
					}
					
					block = get_block_index_entry_for_index(index)->value.load(std::memory_order_relaxed);
				}
				
				((*block)[index])->~T();
				++index;
			}
			// Even if the queue is empty, there's still one block that's not on the free list
			// (unless the head index reached the end of it, in which case the tail will be poised
			// to create a new block).
			if (this->tailBlock != nullptr && (forceFreeLastBlock || (tail & static_cast<index_t>(BLOCK_SIZE - 1)) != 0)) {
				this->parent->add_block_to_free_list(this->tailBlock);
			}
			
			// Destroy block index
			auto localBlockIndex = blockIndex.load(std::memory_order_relaxed);
			if (localBlockIndex != nullptr) {
				for (size_t i = 0; i != localBlockIndex->capacity; ++i) {
					localBlockIndex->index[i]->~BlockIndexEntry();
				}
				do {
					auto prev = localBlockIndex->prev;
					localBlockIndex->~BlockIndexHeader();
					(Traits::free)(localBlockIndex);
					localBlockIndex = prev;
				} while (localBlockIndex != nullptr);
			}
		}